

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deploymentinfo.cpp
# Opt level: O2

string * DeploymentName_abi_cxx11_(string *__return_storage_ptr__,BuriedDeployment dep)

{
  allocator<char> *__a;
  char *__s;
  long in_FS_OFFSET;
  allocator<char> local_15;
  allocator<char> local_14;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  switch(dep) {
  case DEPLOYMENT_HEIGHTINCB:
    __s = "bip34";
    __a = &local_11;
    break;
  case DEPLOYMENT_CLTV:
    __s = "bip65";
    __a = &local_12;
    break;
  case DEPLOYMENT_DERSIG:
    __s = "bip66";
    __a = &local_13;
    break;
  case DEPLOYMENT_CSV:
    __s = "csv";
    __a = &local_14;
    break;
  case DEPLOYMENT_SEGWIT:
    __s = "segwit";
    __a = &local_15;
    break;
  default:
    __assert_fail("ValidDeployment(dep)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/deploymentinfo.cpp"
                  ,0x18,"std::string DeploymentName(Consensus::BuriedDeployment)");
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DeploymentName(Consensus::BuriedDeployment dep)
{
    assert(ValidDeployment(dep));
    switch (dep) {
    case Consensus::DEPLOYMENT_HEIGHTINCB:
        return "bip34";
    case Consensus::DEPLOYMENT_CLTV:
        return "bip65";
    case Consensus::DEPLOYMENT_DERSIG:
        return "bip66";
    case Consensus::DEPLOYMENT_CSV:
        return "csv";
    case Consensus::DEPLOYMENT_SEGWIT:
        return "segwit";
    } // no default case, so the compiler can warn about missing cases
    return "";
}